

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacall_await(char *name,void **args,_func_void_ptr_void_ptr_void_ptr *resolve_callback,
                     _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  type_id tVar1;
  void **args_00;
  signature s_00;
  function_return pvVar2;
  function_reject_callback in_RSI;
  function_conflict in_R8;
  signature s;
  function f;
  value f_val;
  char *in_stack_ffffffffffffffb0;
  value in_stack_ffffffffffffffc0;
  function func;
  function_conflict size;
  
  args_00 = (void **)loader_get(in_stack_ffffffffffffffb0);
  func = (function_conflict)0x0;
  tVar1 = value_type_id(in_stack_ffffffffffffffc0);
  if (tVar1 == 0xd) {
    func = value_to_function(in_stack_ffffffffffffffb0);
  }
  s_00 = function_signature(func);
  size = func;
  signature_count(s_00);
  pvVar2 = function_await(in_R8,args_00,(size_t)size,(function_resolve_callback)s_00,in_RSI,func);
  return pvVar2;
}

Assistant:

void *metacall_await(const char *name, void *args[], void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	signature s = function_signature(f);

	return function_await(f, args, signature_count(s), resolve_callback, reject_callback, data);
}